

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.h
# Opt level: O0

void __thiscall Minisat::Queue<unsigned_int>::insert(Queue<unsigned_int> *this,uint elem)

{
  int iVar1;
  uint *puVar2;
  uint in_ESI;
  vec<unsigned_int> *in_RDI;
  int j_1;
  int j;
  int i;
  vec<unsigned_int> tmp;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  int local_2c;
  int local_28;
  int local_24;
  vec<unsigned_int> local_20 [2];
  
  iVar3 = *(int *)((long)&in_RDI[1].data + 4);
  *(int *)((long)&in_RDI[1].data + 4) = iVar3 + 1;
  puVar2 = vec<unsigned_int>::operator[](in_RDI,iVar3);
  *puVar2 = in_ESI;
  iVar3 = *(int *)((long)&in_RDI[1].data + 4);
  iVar1 = vec<unsigned_int>::size(in_RDI);
  if (iVar3 == iVar1) {
    *(undefined4 *)((long)&in_RDI[1].data + 4) = 0;
  }
  if (*(int *)&in_RDI[1].data == *(int *)((long)&in_RDI[1].data + 4)) {
    vec<unsigned_int>::size(in_RDI);
    vec<unsigned_int>::vec
              ((vec<unsigned_int> *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    local_24 = 0;
    local_28 = *(int *)&in_RDI[1].data;
    while( true ) {
      iVar3 = local_28;
      iVar1 = vec<unsigned_int>::size(in_RDI);
      if (iVar1 <= iVar3) break;
      puVar2 = vec<unsigned_int>::operator[](in_RDI,local_28);
      in_stack_ffffffffffffffac = *puVar2;
      puVar2 = vec<unsigned_int>::operator[](local_20,local_24);
      *puVar2 = in_stack_ffffffffffffffac;
      local_28 = local_28 + 1;
      local_24 = local_24 + 1;
    }
    for (local_2c = 0; local_2c < *(int *)((long)&in_RDI[1].data + 4); local_2c = local_2c + 1) {
      puVar2 = vec<unsigned_int>::operator[](in_RDI,local_2c);
      in_stack_ffffffffffffffa8 = *puVar2;
      puVar2 = vec<unsigned_int>::operator[](local_20,local_24);
      *puVar2 = in_stack_ffffffffffffffa8;
      local_24 = local_24 + 1;
    }
    *(undefined4 *)&in_RDI[1].data = 0;
    iVar1 = vec<unsigned_int>::size(in_RDI);
    *(int *)((long)&in_RDI[1].data + 4) = iVar1;
    vec<unsigned_int>::moveTo
              ((vec<unsigned_int> *)CONCAT44(in_ESI,iVar3),
               (vec<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    vec<unsigned_int>::~vec((vec<unsigned_int> *)0x15fcf8);
  }
  return;
}

Assistant:

void insert(T elem)
    { // INVARIANT: buf[end] is always unused
        buf[end++] = elem;
        if (end == buf.size()) end = 0;
        if (first == end) { // Resize:
            vec<T> tmp((buf.size() * 3 + 1) >> 1);
            //**/printf("queue alloc: %d elems (%.1f MB)\n", tmp.size(), tmp.size() * sizeof(T) / 1000000.0);
            int i = 0;
            for (int j = first; j < buf.size(); j++) tmp[i++] = buf[j];
            for (int j = 0; j < end; j++) tmp[i++] = buf[j];
            first = 0;
            end = buf.size();
            tmp.moveTo(buf);
        }
    }